

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLproxycode
Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,int sockindex,
           Curl_easy *data,_Bool *done)

{
  undefined1 *puVar1;
  uchar **ppuVar2;
  byte bVar3;
  curl_socket_t sockfd;
  curl_proxytype cVar4;
  connect_t cVar5;
  connectdata *pcVar6;
  byte *mem;
  sockaddr *psVar7;
  connectdata *pcVar8;
  bool bVar9;
  uint uVar10;
  resolve_t rVar11;
  CURLcode CVar12;
  size_t sVar13;
  ulong uVar14;
  size_t __n;
  long lVar15;
  long lVar16;
  CURLproxycode CVar17;
  char *pcVar18;
  long lVar19;
  int code;
  Curl_addrinfo *ai;
  size_t __n_00;
  ssize_t written;
  ssize_t actualread;
  Curl_dns_entry *dns;
  char dest [256];
  bool local_171;
  long local_160;
  long local_158;
  char *local_150;
  Curl_dns_entry *local_148;
  char *local_140;
  char local_138 [264];
  
  pcVar6 = data->conn;
  mem = (byte *)(data->state).buffer;
  local_140 = proxy_password;
  memcpy(local_138,"unknown",0x100);
  sockfd = pcVar6->sock[sockindex];
  cVar4 = (pcVar6->socks_proxy).proxytype;
  local_171 = cVar4 == CURLPROXY_SOCKS5;
  local_150 = hostname;
  sVar13 = strlen(hostname);
  pcVar18 = local_150;
  uVar14 = (data->set).socks5auth;
  local_148 = (Curl_dns_entry *)0x0;
  cVar5 = (pcVar6->cnnct).state;
  if (((0xf < cVar5 - CONNECT_SOCKS_INIT) && (cVar5 != CONNECT_SOCKS_INIT)) && (*done == false)) {
    (pcVar6->cnnct).state = CONNECT_SOCKS_INIT;
  }
  switch((pcVar6->cnnct).state) {
  case CONNECT_SOCKS_INIT:
    if (((pcVar6->bits).field_0x4 & 1) != 0) {
      Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",local_150,
                 (ulong)(uint)remote_port);
    }
    bVar9 = 0xff < sVar13 && cVar4 != CURLPROXY_SOCKS5;
    if (bVar9) {
      Curl_infof(data,
                 "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]",
                 sVar13);
    }
    local_171 = bVar9 || local_171;
    if ((uVar14 & 0xfffffffffffffffa) != 0) {
      Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",uVar14);
    }
    *mem = 5;
    mem[2] = 0;
    proxy_user = (char *)((ulong)proxy_user & -(ulong)((uint)uVar14 & 1));
    if (proxy_user == (char *)0x0) {
      uVar10 = 3;
    }
    else {
      mem[3] = 2;
      uVar10 = 4;
    }
    mem[1] = (char)uVar10 - 2;
    CVar12 = Curl_write_plain(data,sockfd,mem,(ulong)uVar10,&local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
LAB_001424e5:
      Curl_failf(data,"Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    pcVar8 = data->conn;
    cVar5 = (pcVar8->cnnct).state;
    lVar19 = (ulong)uVar10 - local_160;
    if (lVar19 != 0) {
      if (cVar5 != CONNECT_SOCKS_SEND) {
        (pcVar8->cnnct).state = CONNECT_SOCKS_SEND;
      }
      (pcVar6->cnnct).outstanding = lVar19;
      (pcVar6->cnnct).outp = mem + local_160;
      return CURLPX_OK;
    }
    if (cVar5 != CONNECT_SOCKS_READ) {
      (pcVar8->cnnct).state = CONNECT_SOCKS_READ;
    }
    break;
  case CONNECT_SOCKS_SEND:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                              &local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) goto LAB_001424e5;
    lVar16 = (pcVar6->cnnct).outstanding - local_160;
    lVar15 = local_160;
    if (lVar16 != 0) goto LAB_001428f5;
    break;
  case CONNECT_SOCKS_READ_INIT:
    break;
  case CONNECT_SOCKS_READ:
    goto LAB_00142437;
  default:
    goto switchD_00141f0d_caseD_5;
  case CONNECT_AUTH_INIT:
    goto switchD_00141f0d_caseD_6;
  case CONNECT_AUTH_SEND:
    lVar19 = 0;
    goto LAB_00142737;
  case CONNECT_AUTH_READ:
    lVar19 = 0;
    goto LAB_00142792;
  case CONNECT_REQ_INIT:
    lVar19 = 0;
    goto LAB_00141fbc;
  case CONNECT_RESOLVING:
    local_148 = Curl_fetch_addr(data,local_150,remote_port);
    if (local_148 != (Curl_dns_entry *)0x0) {
      (data->state).async.dns = local_148;
      puVar1 = &(data->state).async.field_0x28;
      *puVar1 = *puVar1 | 1;
      Curl_infof(data,"SOCKS5: hostname \'%s\' found",pcVar18);
    }
    if ((local_148 == (Curl_dns_entry *)0x0) &&
       (CVar12 = Curl_resolv_check(data,&local_148), local_148 == (Curl_dns_entry *)0x0)) {
      if (CVar12 == CURLE_OK) {
        return CURLPX_OK;
      }
      return CURLPX_RESOLVE_HOST;
    }
  case CONNECT_RESOLVED:
    lVar19 = 0;
    goto LAB_001420d2;
  case CONNECT_RESOLVE_REMOTE:
    goto LAB_00142016;
  case CONNECT_REQ_SEND:
    lVar19 = 0;
    goto LAB_0014227a;
  case CONNECT_REQ_SENDING:
    goto switchD_00141f0d_caseD_e;
  case CONNECT_REQ_READ:
    goto switchD_00141f0d_caseD_f;
  case CONNECT_REQ_READ_MORE:
    goto switchD_00141f0d_caseD_10;
  }
  (pcVar6->cnnct).outstanding = 2;
  (pcVar6->cnnct).outp = mem;
LAB_00142437:
  CVar12 = Curl_read_plain(sockfd,(char *)(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                           &local_158);
  if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
    Curl_failf(data,"Unable to receive initial SOCKS5 response.");
    return CURLPX_RECV_CONNECT;
  }
  if (local_158 == 0 && CVar12 == CURLE_OK) {
    pcVar18 = "Connection to proxy closed";
    goto LAB_0014290a;
  }
  lVar16 = (pcVar6->cnnct).outstanding - local_158;
  lVar15 = local_158;
  if (lVar16 != 0) goto LAB_001428f5;
  if (*mem != 5) {
    pcVar18 = "Received invalid version in initial SOCKS5 response.";
    goto LAB_0014252d;
  }
  bVar3 = mem[1];
  if (bVar3 < 2) {
    if (bVar3 != 0) {
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
LAB_001425d0:
      Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
      return CURLPX_UNKNOWN_MODE;
    }
    pcVar8 = data->conn;
    lVar19 = 0;
    cVar5 = (pcVar8->cnnct).state;
joined_r0x00142841:
    if (cVar5 != CONNECT_REQ_INIT) {
      (pcVar8->cnnct).state = CONNECT_REQ_INIT;
    }
LAB_00141fbc:
    if (local_171) {
      bVar9 = false;
      rVar11 = Curl_resolv(data,local_150,remote_port,false,&local_148);
      if (rVar11 == CURLRESOLV_ERROR) {
        proxy_user = (char *)0x1b;
      }
      else if (rVar11 == CURLRESOLV_PENDING) {
        bVar9 = false;
        proxy_user = (char *)0x0;
        if ((data->conn->cnnct).state != CONNECT_RESOLVING) {
          (data->conn->cnnct).state = CONNECT_RESOLVING;
          bVar9 = false;
          proxy_user = (char *)0x0;
        }
      }
      else {
        bVar9 = true;
        if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
          (data->conn->cnnct).state = CONNECT_RESOLVED;
        }
      }
      if (!bVar9) {
        return (CURLproxycode)proxy_user;
      }
LAB_001420d2:
      CVar17 = (CURLproxycode)proxy_user;
      if (local_148 == (Curl_dns_entry *)0x0) {
        ai = (Curl_addrinfo *)0x0;
      }
      else {
        ai = local_148->addr;
      }
      if (ai == (Curl_addrinfo *)0x0) {
        Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",local_150);
        CVar17 = CURLPX_RESOLVE_HOST;
      }
      else {
        Curl_printable_address(ai,local_138,0x100);
        sVar13 = strlen(local_138);
        curl_msnprintf(local_138 + sVar13,0x100 - sVar13,":%d");
        mem[0] = 5;
        mem[1] = 1;
        mem[2] = 0;
        if (ai->ai_family == 10) {
          mem[3] = 4;
          psVar7 = ai->ai_addr;
          lVar19 = 0;
          do {
            mem[lVar19 + 4] = psVar7->sa_data[lVar19 + 6];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 0x10);
          Curl_infof(data,"SOCKS5 connect to IPv6 %s (locally resolved)",local_138);
          lVar19 = 0x14;
        }
        else if (ai->ai_family == 2) {
          mem[3] = 1;
          psVar7 = ai->ai_addr;
          lVar19 = 0;
          do {
            mem[lVar19 + 4] = psVar7->sa_data[lVar19 + 2];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          Curl_infof(data,"SOCKS5 connect to IPv4 %s (locally resolved)",local_138);
          lVar19 = 8;
        }
        else {
          Curl_failf(data,"SOCKS5 connection to %s not supported",local_138);
          lVar19 = 3;
        }
        Curl_resolv_unlock(data,local_148);
      }
      if (ai == (Curl_addrinfo *)0x0) {
        return CVar17;
      }
    }
    else {
LAB_00142016:
      pcVar18 = local_150;
      mem[0] = 5;
      mem[1] = 1;
      mem[2] = 0;
      lVar19 = 3;
      if (!local_171) {
        mem[3] = 3;
        mem[4] = (byte)sVar13;
        memcpy(mem + 5,local_150,sVar13);
        lVar19 = sVar13 + 5;
        Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",pcVar18,
                   (ulong)(uint)remote_port);
      }
    }
LAB_0014227a:
    *(ushort *)(mem + lVar19) = (ushort)remote_port << 8 | (ushort)remote_port >> 8;
    (pcVar6->cnnct).outp = mem;
    (pcVar6->cnnct).outstanding = lVar19 + 2;
    if ((data->conn->cnnct).state != CONNECT_REQ_SENDING) {
      (data->conn->cnnct).state = CONNECT_REQ_SENDING;
    }
switchD_00141f0d_caseD_e:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                              &local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    lVar16 = (pcVar6->cnnct).outstanding - local_160;
    lVar15 = local_160;
    if (lVar16 != 0) {
LAB_001428f5:
      (pcVar6->cnnct).outstanding = lVar16;
      ppuVar2 = &(pcVar6->cnnct).outp;
      *ppuVar2 = *ppuVar2 + lVar15;
      return CURLPX_OK;
    }
    (pcVar6->cnnct).outstanding = 10;
    (pcVar6->cnnct).outp = mem;
    if ((data->conn->cnnct).state != CONNECT_REQ_READ) {
      (data->conn->cnnct).state = CONNECT_REQ_READ;
    }
switchD_00141f0d_caseD_f:
    CVar12 = Curl_read_plain(sockfd,(char *)(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                             &local_158);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    if (local_158 != 0 || CVar12 != CURLE_OK) {
      lVar16 = (pcVar6->cnnct).outstanding - local_158;
      lVar15 = local_158;
      if (lVar16 != 0) goto LAB_001428f5;
      if (*mem != 5) {
        pcVar18 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_0014252d:
        Curl_failf(data,pcVar18);
        return CURLPX_BAD_VERSION;
      }
      bVar3 = mem[1];
      if (bVar3 != 0) {
        Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",local_150,(ulong)bVar3);
        if (bVar3 < 9) {
          return Curl_SOCKS5::lookup[bVar3];
        }
        return CURLPX_REPLY_UNASSIGNED;
      }
      bVar3 = mem[3];
      if (bVar3 == 1) {
        uVar14 = 10;
      }
      else if (bVar3 == 4) {
        uVar14 = 0x16;
      }
      else {
        if (bVar3 != 3) {
          Curl_failf(data,"SOCKS5 reply has wrong address type.");
          return CURLPX_BAD_ADDRESS_TYPE;
        }
        uVar14 = (ulong)mem[4] + 7;
      }
      if (10 < uVar14) {
        (pcVar6->cnnct).outstanding = uVar14 - 10;
        (pcVar6->cnnct).outp = mem + 10;
        if ((data->conn->cnnct).state != CONNECT_REQ_READ_MORE) {
          (data->conn->cnnct).state = CONNECT_REQ_READ_MORE;
        }
switchD_00141f0d_caseD_10:
        CVar12 = Curl_read_plain(sockfd,(char *)(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                                 &local_158);
        if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
          Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
          return CURLPX_RECV_ADDRESS;
        }
        if (local_158 == 0 && CVar12 == CURLE_OK) goto LAB_00142903;
        lVar16 = (pcVar6->cnnct).outstanding - local_158;
        lVar15 = local_158;
        if (lVar16 != 0) goto LAB_001428f5;
      }
      if ((data->conn->cnnct).state != CONNECT_DONE) {
        (data->conn->cnnct).state = CONNECT_DONE;
      }
switchD_00141f0d_caseD_5:
      Curl_infof(data,"SOCKS5 request granted.");
      *done = true;
      return CURLPX_OK;
    }
  }
  else {
    if (bVar3 != 2) {
      if (bVar3 == 0xff) {
        Curl_failf(data,"No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
      goto LAB_001425d0;
    }
    if ((data->conn->cnnct).state != CONNECT_AUTH_INIT) {
      (data->conn->cnnct).state = CONNECT_AUTH_INIT;
    }
switchD_00141f0d_caseD_6:
    __n = 0;
    if (local_140 == (char *)0x0) {
      __n_00 = 0;
    }
    else {
      __n_00 = 0;
      if (proxy_user != (char *)0x0) {
        __n = strlen(proxy_user);
        __n_00 = strlen(local_140);
      }
    }
    *mem = 1;
    mem[1] = (byte)__n;
    if (__n == 0 || proxy_user == (char *)0x0) {
LAB_001426ac:
      mem[__n + 2] = (byte)__n_00;
      lVar19 = __n + 3;
      if (__n_00 != 0 && local_140 != (char *)0x0) {
        if (0xff < __n_00) {
          Curl_failf(data,"Excessive password length for proxy auth");
          proxy_user = (char *)0xa;
          goto LAB_001426f2;
        }
        memcpy(mem + lVar19,local_140,__n_00);
      }
      lVar19 = lVar19 + __n_00;
      if ((data->conn->cnnct).state != CONNECT_AUTH_SEND) {
        (data->conn->cnnct).state = CONNECT_AUTH_SEND;
      }
      (pcVar6->cnnct).outstanding = lVar19;
      (pcVar6->cnnct).outp = mem;
      bVar9 = true;
    }
    else {
      if (__n < 0xff) {
        memcpy(mem + 2,proxy_user,__n);
        goto LAB_001426ac;
      }
      Curl_failf(data,"Excessive user name length for proxy auth");
      proxy_user = (char *)0xb;
      lVar19 = 2;
LAB_001426f2:
      bVar9 = false;
    }
    if (!bVar9) {
      return (CURLproxycode)proxy_user;
    }
LAB_00142737:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                              &local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    lVar16 = (pcVar6->cnnct).outstanding - local_160;
    lVar15 = local_160;
    if (lVar16 != 0) goto LAB_001428f5;
    (pcVar6->cnnct).outp = mem;
    (pcVar6->cnnct).outstanding = 2;
    if ((data->conn->cnnct).state != CONNECT_AUTH_READ) {
      (data->conn->cnnct).state = CONNECT_AUTH_READ;
    }
LAB_00142792:
    CVar12 = Curl_read_plain(sockfd,(char *)(pcVar6->cnnct).outp,(pcVar6->cnnct).outstanding,
                             &local_158);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    if (local_158 != 0 || CVar12 != CURLE_OK) {
      lVar16 = (pcVar6->cnnct).outstanding - local_158;
      lVar15 = local_158;
      if (lVar16 != 0) goto LAB_001428f5;
      if (mem[1] != 0) {
        Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*mem);
        return CURLPX_USER_REJECTED;
      }
      pcVar8 = data->conn;
      cVar5 = (pcVar8->cnnct).state;
      goto joined_r0x00142841;
    }
  }
LAB_00142903:
  pcVar18 = "connection to proxy closed";
LAB_0014290a:
  Curl_failf(data,pcVar18);
  return CURLPX_CLOSED;
}

Assistant:

CURLproxycode Curl_SOCKS5(const char *proxy_user,
                          const char *proxy_password,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */
  struct connectdata *conn = data->conn;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  char dest[256] = "unknown";  /* printable hostname:port */
  int idx;
  ssize_t actualread;
  ssize_t written;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    if(conn->bits.httpproxy)
      infof(data, "SOCKS5: connecting to HTTP proxy %s port %d",
            hostname, remote_port);

    /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
    if(!socks5_resolve_local && hostname_len > 255) {
      infof(data, "SOCKS5: server resolving disabled for hostnames of "
            "length > 255 [actual len=%zu]", hostname_len);
      socks5_resolve_local = TRUE;
    }

    if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
      infof(data,
            "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",
            auth);
    if(!(auth & CURLAUTH_BASIC))
      /* disable username/password auth */
      proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(auth & CURLAUTH_GSSAPI)
      allow_gssapi = TRUE;
#endif

    idx = 0;
    socksreq[idx++] = 5;   /* version */
    idx++;                 /* number of authentication methods */
    socksreq[idx++] = 0;   /* no authentication */
    if(allow_gssapi)
      socksreq[idx++] = 1; /* GSS-API */
    if(proxy_user)
      socksreq[idx++] = 2; /* username/password */
    /* write the number of authentication methods */
    socksreq[1] = (unsigned char) (idx - 2);

    result = Curl_write_plain(data, sockfd, (char *)socksreq, idx, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != idx) {
      sxstate(data, CONNECT_SOCKS_SEND);
      sx->outstanding = idx - written;
      sx->outp = &socksreq[written];
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_SOCKS_READ);
    goto CONNECT_SOCKS_READ_INIT;
  case CONNECT_SOCKS_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    /* FALLTHROUGH */
  CONNECT_SOCKS_READ_INIT:
  case CONNECT_SOCKS_READ_INIT:
    sx->outstanding = 2; /* expect two bytes */
    sx->outp = socksreq; /* store it here */
    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive initial SOCKS5 response.");
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "Connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    else if(socksreq[0] != 5) {
      failf(data, "Received invalid version in initial SOCKS5 response.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1] == 0) {
      /* DONE! No authentication needed. Send request. */
      sxstate(data, CONNECT_REQ_INIT);
      goto CONNECT_REQ_INIT;
    }
    else if(socksreq[1] == 2) {
      /* regular name + password authentication */
      sxstate(data, CONNECT_AUTH_INIT);
      goto CONNECT_AUTH_INIT;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    else if(allow_gssapi && (socksreq[1] == 1)) {
      sxstate(data, CONNECT_GSSAPI_INIT);
      result = Curl_SOCKS5_gssapi_negotiate(sockindex, data);
      if(result) {
        failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
        return CURLPX_GSSAPI;
      }
    }
#endif
    else {
      /* error */
      if(!allow_gssapi && (socksreq[1] == 1)) {
        failf(data,
              "SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
      else if(socksreq[1] == 255) {
        failf(data, "No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
    }
    failf(data,
          "Undocumented SOCKS5 mode attempted to be used by server.");
    return CURLPX_UNKNOWN_MODE;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  case CONNECT_GSSAPI_INIT:
    /* GSSAPI stuff done non-blocking */
    break;
#endif

  default: /* do nothing! */
    break;

  CONNECT_AUTH_INIT:
  case CONNECT_AUTH_INIT: {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len) {
      /* the length must fit in a single byte */
      if(proxy_user_len >= 255) {
        failf(data, "Excessive user name length for proxy auth");
        return CURLPX_LONG_USER;
      }
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    }
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len) {
      /* the length must fit in a single byte */
      if(proxy_password_len > 255) {
        failf(data, "Excessive password length for proxy auth");
        return CURLPX_LONG_PASSWD;
      }
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    }
    len += proxy_password_len;
    sxstate(data, CONNECT_AUTH_SEND);
    sx->outstanding = len;
    sx->outp = socksreq;
  }
    /* FALLTHROUGH */
  case CONNECT_AUTH_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    sx->outp = socksreq;
    sx->outstanding = 2;
    sxstate(data, CONNECT_AUTH_READ);
    /* FALLTHROUGH */
  case CONNECT_AUTH_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    /* ignore the first (VER) byte */
    else if(socksreq[1]) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLPX_USER_REJECTED;
    }

    /* Everything is good so far, user was authenticated! */
    sxstate(data, CONNECT_REQ_INIT);
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    if(socks5_resolve_local) {
      enum resolve_t rc = Curl_resolv(data, hostname, remote_port,
                                      FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;

      if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }
    goto CONNECT_RESOLVE_REMOTE;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, remote_port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "SOCKS5: hostname '%s' found", hostname);
    }

    if(!dns) {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    size_t destlen;
    if(dns)
      hp = dns->addr;
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLPX_RESOLVE_HOST;
    }

    Curl_printable_address(hp, dest, sizeof(dest));
    destlen = strlen(dest);
    msnprintf(dest + destlen, sizeof(dest) - destlen, ":%d", remote_port);

    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */
    if(hp->ai_family == AF_INET) {
      int i;
      struct sockaddr_in *saddr_in;
      socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

      saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
      for(i = 0; i < 4; i++) {
        socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)", dest);
    }
#ifdef ENABLE_IPV6
    else if(hp->ai_family == AF_INET6) {
      int i;
      struct sockaddr_in6 *saddr_in6;
      socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

      saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
      for(i = 0; i < 16; i++) {
        socksreq[len++] =
          ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)", dest);
    }
#endif
    else {
      hp = NULL; /* fail! */
      failf(data, "SOCKS5 connection to %s not supported", dest);
    }

    Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    goto CONNECT_REQ_SEND;
  }
  CONNECT_RESOLVE_REMOTE:
  case CONNECT_RESOLVE_REMOTE:
    /* Authentication is complete, now specify destination to the proxy */
    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */

    if(!socks5_resolve_local) {
      socksreq[len++] = 3; /* ATYP: domain name = 3 */
      socksreq[len++] = (char) hostname_len; /* one byte address length */
      memcpy(&socksreq[len], hostname, hostname_len); /* address w/o NULL */
      len += hostname_len;
      infof(data, "SOCKS5 connect to %s:%d (remotely resolved)",
            hostname, remote_port);
    }
    /* FALLTHROUGH */

  CONNECT_REQ_SEND:
  case CONNECT_REQ_SEND:
    /* PORT MSB */
    socksreq[len++] = (unsigned char)((remote_port >> 8) & 0xff);
    /* PORT LSB */
    socksreq[len++] = (unsigned char)(remote_port & 0xff);

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outp = socksreq;
    sx->outstanding = len;
    sxstate(data, CONNECT_REQ_SENDING);
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outstanding = 10; /* minimum packet size is 10 */
    sx->outp = socksreq;
    sxstate(data, CONNECT_REQ_READ);
    /* FALLTHROUGH */
  case CONNECT_REQ_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }

    if(socksreq[0] != 5) { /* version */
      failf(data,
            "SOCKS5 reply has wrong version, version should be 5.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1]) { /* Anything besides 0 is an error */
      CURLproxycode rc = CURLPX_REPLY_UNASSIGNED;
      int code = socksreq[1];
      failf(data, "Can't complete SOCKS5 connection to %s. (%d)",
            hostname, (unsigned char)socksreq[1]);
      if(code < 9) {
        /* RFC 1928 section 6 lists: */
        static const CURLproxycode lookup[] = {
          CURLPX_OK,
          CURLPX_REPLY_GENERAL_SERVER_FAILURE,
          CURLPX_REPLY_NOT_ALLOWED,
          CURLPX_REPLY_NETWORK_UNREACHABLE,
          CURLPX_REPLY_HOST_UNREACHABLE,
          CURLPX_REPLY_CONNECTION_REFUSED,
          CURLPX_REPLY_TTL_EXPIRED,
          CURLPX_REPLY_COMMAND_NOT_SUPPORTED,
          CURLPX_REPLY_ADDRESS_TYPE_NOT_SUPPORTED,
        };
        rc = lookup[code];
      }
      return rc;
    }

    /* Fix: in general, returned BND.ADDR is variable length parameter by RFC
       1928, so the reply packet should be read until the end to avoid errors
       at subsequent protocol level.

       +----+-----+-------+------+----------+----------+
       |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
       +----+-----+-------+------+----------+----------+
       | 1  |  1  | X'00' |  1   | Variable |    2     |
       +----+-----+-------+------+----------+----------+

       ATYP:
       o  IP v4 address: X'01', BND.ADDR = 4 byte
       o  domain name:  X'03', BND.ADDR = [ 1 byte length, string ]
       o  IP v6 address: X'04', BND.ADDR = 16 byte
    */

    /* Calculate real packet size */
    if(socksreq[3] == 3) {
      /* domain name */
      int addrlen = (int) socksreq[4];
      len = 5 + addrlen + 2;
    }
    else if(socksreq[3] == 4) {
      /* IPv6 */
      len = 4 + 16 + 2;
    }
    else if(socksreq[3] == 1) {
      len = 4 + 4 + 2;
    }
    else {
      failf(data, "SOCKS5 reply has wrong address type.");
      return CURLPX_BAD_ADDRESS_TYPE;
    }

    /* At this point we already read first 10 bytes */
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(!conn->socks5_gssapi_enctype) {
      /* decrypt_gssapi_blockread already read the whole packet */
#endif
      if(len > 10) {
        sx->outstanding = len - 10; /* get the rest */
        sx->outp = &socksreq[10];
        sxstate(data, CONNECT_REQ_READ_MORE);
      }
      else {
        sxstate(data, CONNECT_DONE);
        break;
      }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    }
#endif
    /* FALLTHROUGH */
  case CONNECT_REQ_READ_MORE:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_ADDRESS;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
  }
  infof(data, "SOCKS5 request granted.");

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}